

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  Options *options;
  CType CVar1;
  LogMessage *other;
  Formatter format;
  _func_void_FieldDescriptor_ptr *local_a8;
  FieldDescriptor *local_a0;
  LogMessage local_98;
  Formatter local_60;
  
  local_60.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  if (this->inlined_ == true) {
    if (*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x40) + 8) == 0)
    goto LAB_002ebb11;
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_string_field.cc"
               ,0x1b8);
    other = internal::LogMessage::operator<<(&local_98,"CHECK failed: !inlined_: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
    internal::LogMessage::~LogMessage(&local_98);
  }
  Formatter::operator()<>(&local_60,"$name$_.UnsafeSetDefault($init_value$);\n");
  field = (this->super_FieldGenerator).descriptor_;
  options = (this->super_FieldGenerator).options_;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_a8 = FieldDescriptor::TypeOnceInit;
    local_a0 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_a8,&local_a0);
  }
  if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 9) &&
      (CVar1 = EffectiveStringCType(field,options), CVar1 == FieldOptions_CType_STRING)) &&
     (*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x40) + 8) == 0)) {
    Formatter::operator()<>
              (&local_60,
               "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
              );
  }
LAB_002ebb11:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateConstructorCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (inlined_ && descriptor_->default_value_string().empty()) {
    // Automatic initialization will construct the string.
    return;
  }
  GOOGLE_DCHECK(!inlined_);
  format("$name$_.UnsafeSetDefault($init_value$);\n");
  if (IsString(descriptor_, options_) &&
      descriptor_->default_value_string().empty()) {
    format(
        "#ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING\n"
        "  $name$_.Set($init_value$, \"\", GetArenaForAllocation());\n"
        "#endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING\n");
  }
}